

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm.c
# Opt level: O0

int put_pitch(int p)

{
  size_t sVar1;
  char local_14 [8];
  char result [8];
  int p_local;
  
  result._0_4_ = p;
  sprintf(local_14,"%s%d",put_pitch::ptos[p % 0xc],(ulong)(p / 0xc - 1));
  printf("%s\n",local_14);
  sVar1 = strlen(local_14);
  return (int)sVar1;
}

Assistant:

private int put_pitch(int p)
{
    char result[8];
    static char *ptos[] = {
        "c", "cs", "d", "ef", "e", "f", "fs", "g",
        "gs", "a", "bf", "b"    };
    /* note octave correction below */
    sprintf(result, "%s%d", ptos[p % 12], (p / 12) - 1);
    printf("%s\n", result);
    return (int)strlen(result);
}